

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumDescriptor::CopyTo(EnumDescriptor *this,EnumDescriptorProto *proto)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined8 uVar4;
  ulong uVar5;
  long lVar6;
  Rep *pRVar7;
  EnumValueDescriptorProto *pEVar8;
  EnumDescriptorProto_EnumReservedRange *obj;
  void *pvVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *obj_00;
  string *psVar10;
  EnumOptions *this_00;
  undefined8 *puVar11;
  long lVar12;
  EnumOptions *from;
  Arena *arena;
  long lVar13;
  
  uVar4 = *(undefined8 *)(this + 8);
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  uVar5 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar11 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar11 = (undefined8 *)*puVar11;
  }
  internal::ArenaStringPtr::Set(&proto->name_,uVar4,puVar11);
  if (0 < *(int *)(this + 4)) {
    lVar13 = 0;
    lVar12 = 0;
    do {
      lVar6 = *(long *)(this + 0x28);
      pRVar7 = (proto->value_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_00348e55:
        pEVar8 = Arena::CreateMaybeMessage<google::protobuf::EnumValueDescriptorProto>
                           ((proto->value_).super_RepeatedPtrFieldBase.arena_);
        pEVar8 = (EnumValueDescriptorProto *)
                 internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                           (&(proto->value_).super_RepeatedPtrFieldBase,pEVar8);
      }
      else {
        iVar1 = (proto->value_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar1) goto LAB_00348e55;
        (proto->value_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pEVar8 = (EnumValueDescriptorProto *)pRVar7->elements[iVar1];
      }
      EnumValueDescriptor::CopyTo((EnumValueDescriptor *)(lVar6 + lVar13),pEVar8);
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0x20;
    } while (lVar12 < *(int *)(this + 4));
  }
  if (0 < *(int *)(this + 0x30)) {
    lVar12 = 0;
    do {
      pRVar7 = (proto->reserved_range_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_00348eaf:
        obj = Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                        ((proto->reserved_range_).super_RepeatedPtrFieldBase.arena_);
        pvVar9 = internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                           (&(proto->reserved_range_).super_RepeatedPtrFieldBase,obj);
      }
      else {
        iVar1 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar1) goto LAB_00348eaf;
        (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pvVar9 = pRVar7->elements[iVar1];
      }
      lVar13 = *(long *)(this + 0x38);
      uVar2 = *(undefined4 *)(lVar13 + lVar12 * 8);
      uVar3 = *(uint *)((long)pvVar9 + 0x10);
      *(uint *)((long)pvVar9 + 0x10) = uVar3 | 1;
      *(undefined4 *)((long)pvVar9 + 0x18) = uVar2;
      uVar2 = *(undefined4 *)(lVar13 + 4 + lVar12 * 8);
      *(uint *)((long)pvVar9 + 0x10) = uVar3 | 3;
      *(undefined4 *)((long)pvVar9 + 0x1c) = uVar2;
      lVar12 = lVar12 + 1;
    } while (lVar12 < *(int *)(this + 0x30));
  }
  if (0 < *(int *)(this + 0x34)) {
    lVar12 = 0;
    do {
      pRVar7 = (proto->reserved_name_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_00348f26:
        obj_00 = Arena::Create<std::__cxx11::string>
                           ((proto->reserved_name_).super_RepeatedPtrFieldBase.arena_);
        psVar10 = (string *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(proto->reserved_name_).super_RepeatedPtrFieldBase,obj_00);
      }
      else {
        iVar1 = (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar1) goto LAB_00348f26;
        (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        psVar10 = (string *)pRVar7->elements[iVar1];
      }
      std::__cxx11::string::_M_assign(psVar10);
      lVar12 = lVar12 + 1;
    } while (lVar12 < *(int *)(this + 0x34));
  }
  from = *(EnumOptions **)(this + 0x20);
  if (from != (EnumOptions *)_EnumOptions_default_instance_) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    this_00 = proto->options_;
    if (this_00 == (EnumOptions *)0x0) {
      uVar5 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      arena = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      this_00 = Arena::CreateMaybeMessage<google::protobuf::EnumOptions>(arena);
      proto->options_ = this_00;
      from = *(EnumOptions **)(this + 0x20);
    }
    EnumOptions::CopyFrom(this_00,from);
    return;
  }
  return;
}

Assistant:

void EnumDescriptor::CopyTo(EnumDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < value_count(); i++) {
    value(i)->CopyTo(proto->add_value());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    EnumDescriptorProto::EnumReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &EnumOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}